

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

size_type __thiscall wabt::string_view::rfind(string_view *this,string_view s,size_type pos)

{
  bool bVar1;
  unsigned_long *puVar2;
  const_iterator pcVar3;
  long lVar4;
  size_type local_80;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  string_view local_50;
  reverse_iterator<const_char_*> local_40;
  reverse_iterator iter;
  char *local_30;
  size_type local_28;
  size_type pos_local;
  string_view *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (string_view *)s.data_;
  iter.current = (char *)(this->size_ - (long)s_local.data_);
  local_28 = pos;
  pos_local = (size_type)this;
  puVar2 = std::min<unsigned_long>(&local_28,(unsigned_long *)&iter);
  local_30 = s_local.data_ + *puVar2;
  puVar2 = std::min<unsigned_long>((unsigned_long *)&local_30,&this->size_);
  local_28 = *puVar2;
  pcVar3 = begin(this);
  std::reverse_iterator<const_char_*>::reverse_iterator
            ((reverse_iterator<const_char_*> *)&local_50.size_,pcVar3 + local_28);
  rend(&local_50);
  rbegin((string_view *)(local_60 + 8));
  rend((string_view *)local_60);
  std::search<std::reverse_iterator<char_const*>,std::reverse_iterator<char_const*>>
            (&local_40,(reverse_iterator<const_char_*> *)&local_50.size_,
             (reverse_iterator<const_char_*> *)&local_50,
             (reverse_iterator<const_char_*> *)(local_60 + 8));
  rend((string_view *)(local_70 + 8));
  bVar1 = std::operator==(&local_40,(reverse_iterator<const_char_*> *)(local_70 + 8));
  if (bVar1) {
    local_80 = 0xffffffffffffffff;
  }
  else {
    rend((string_view *)local_70);
    lVar4 = std::operator-((reverse_iterator<const_char_*> *)local_70,&local_40);
    local_80 = lVar4 - (long)s_local.data_;
  }
  return local_80;
}

Assistant:

string_view::size_type string_view::rfind(string_view s, size_type pos) const
    noexcept {
  pos = std::min(std::min(pos, size_ - s.size_) + s.size_, size_);
  reverse_iterator iter = std::search(reverse_iterator(begin() + pos), rend(),
                                      s.rbegin(), s.rend());
  return iter == rend() ? npos : (rend() - iter - s.size_);
}